

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O1

MPI_Datatype mxx::datatype_builder<std::pair<int,_double>_>::get_type(void)

{
  long __tmp;
  MPI_Aint displs [2];
  MPI_Datatype types [2];
  int blocklen [2];
  MPI_Datatype struct_type;
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  pair<int,_double> p;
  MPI_Datatype _type;
  long local_88;
  long lStack_80;
  undefined *local_78;
  undefined *local_70;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined4 local_38 [2];
  undefined8 local_30;
  MPI_Datatype local_28;
  
  local_60 = 0x100000001;
  local_88 = 0;
  lStack_80 = 0;
  local_38[0] = 0;
  local_30 = 0;
  MPI_Get_address(local_38,&local_40);
  MPI_Get_address(local_38,&local_48);
  MPI_Get_address(&local_30,&local_50);
  local_78 = &ompi_mpi_int;
  local_70 = &ompi_mpi_double;
  local_88 = local_48 - local_40;
  lStack_80 = local_50 - local_40;
  if (local_50 < local_48) {
    local_78 = &ompi_mpi_double;
    local_70 = &ompi_mpi_int;
    local_88 = local_50 - local_40;
    lStack_80 = local_48 - local_40;
  }
  MPI_Type_create_struct(2,&local_60,&local_88,&local_78,&local_58);
  MPI_Type_create_resized(local_58,0,0x10,&local_28);
  MPI_Type_commit(&local_28);
  MPI_Type_free(&local_58);
  return local_28;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }